

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_syst_inv.c
# Opt level: O3

_Bool test_syst_inv(int K_lower,int K_upper)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  void *__ptr;
  void *__ptr_00;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  size_t interProgSize;
  size_t interWorkSize;
  size_t interSymNum;
  size_t local_48;
  size_t local_40;
  undefined1 local_38 [8];
  
  puts("Checking for invertibility from the K source symbols.");
  lVar5 = 0;
  uVar7 = 0;
  do {
    uVar1 = *(uint *)((long)Kprime + lVar5);
    if (K_upper < (int)uVar1) break;
    if (K_lower <= (int)uVar1) {
      printf("--> Checking K=%d\n",(ulong)uVar1);
      uVar3 = RqInterGetMemSizes(uVar1,0,&local_40,&local_48,local_38);
      sVar2 = local_40;
      if ((int)uVar3 < 0) {
        pcVar6 = "RqInterGetMemSizes(K, 0, &interWorkSize, &interProgSize, &interSymNum)";
        uVar4 = 0x57;
LAB_001013b4:
        fprintf(_stderr,"Error:%s:%d: %s failed: %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/rq_syst_inv.c"
                ,uVar4,pcVar6,(ulong)uVar3);
        return false;
      }
      __ptr = malloc(local_40);
      uVar3 = RqInterInit(uVar1,0,__ptr,sVar2);
      if ((int)uVar3 < 0) {
        pcVar6 = "RqInterInit(K, 0, interWork, interWorkSize)";
        uVar4 = 0x59;
        goto LAB_001013b4;
      }
      uVar3 = RqInterAddIds(__ptr,0,uVar1);
      sVar2 = local_48;
      if ((int)uVar3 < 0) {
        pcVar6 = "RqInterAddIds(interWork, 0, K)";
        uVar4 = 0x5a;
        goto LAB_001013b4;
      }
      __ptr_00 = malloc(local_48);
      uVar3 = RqInterCompile(__ptr,__ptr_00,sVar2);
      if ((int)uVar3 < 0) {
        pcVar6 = "RqInterCompile(interWork, interProg, interProgSize)";
        uVar4 = 0x5c;
        goto LAB_001013b4;
      }
      free(__ptr_00);
      free(__ptr);
      uVar7 = uVar7 + 1;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x774);
  printf("--> Passed, %d values were tested.\n",(ulong)uVar7);
  return true;
}

Assistant:

bool test_syst_inv(int K_lower, int K_upper)
{
	printf("Checking for invertibility from the K source symbols.\n");
	int ntest = 0;
	int i;
	for (i = 0; i < n_Kprime && Kprime[i] <= K_upper; ++i) {
		const int K = Kprime[i];
		if (K < K_lower)
			continue;
		printf("--> Checking K=%d\n", K);
		size_t interWorkSize, interProgSize, interSymNum;
#define RUN_NOFAIL(x) \
	do { \
		int RUN_NOFAIL_err; \
		if ((RUN_NOFAIL_err = (x)) < 0) { \
			fprintf(stderr, "Error:%s:%d: %s failed: %d.\n", \
				__FILE__, __LINE__, #x, RUN_NOFAIL_err); \
			return false; \
		} \
	} while(0)

		RUN_NOFAIL(RqInterGetMemSizes(K, 0,
		  &interWorkSize, &interProgSize, &interSymNum));
		RqInterWorkMem* interWork = malloc(interWorkSize);
		RUN_NOFAIL(RqInterInit(K, 0, interWork, interWorkSize));
		RUN_NOFAIL(RqInterAddIds(interWork, 0, K));
		RqInterProgram* interProg = malloc(interProgSize);
		RUN_NOFAIL(RqInterCompile(interWork, interProg, interProgSize));
#undef RUN_NOFAIL

		free(interProg);
		free(interWork);

		++ntest;
	}
	printf("--> Passed, %d values were tested.\n", ntest);
	return true;
}